

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void fejer2_compute(int n,double *x,double *w)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_48;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FEJER2_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
    exit(1);
  }
  if (n == 2) {
    *x = -0.5;
    x[1] = 0.5;
    *w = 1.0;
    w[1] = 1.0;
  }
  else {
    if (n != 1) {
      uVar6 = (ulong)(uint)n;
      pvVar1 = operator_new__(uVar6 * 8);
      dVar9 = (double)(int)(n + 1U);
      iVar3 = n;
      for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
        *(double *)((long)pvVar1 + uVar2 * 8) = ((double)iVar3 * 3.141592653589793) / dVar9;
        iVar3 = iVar3 + -1;
      }
      for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
        dVar7 = cos(*(double *)((long)pvVar1 + uVar2 * 8));
        x[uVar2] = dVar7;
      }
      dVar7 = (double)(n + 1U >> 1);
      dVar7 = dVar7 + dVar7 + -1.0;
      for (uVar2 = 0; uVar2 != uVar6; uVar2 = uVar2 + 1) {
        uVar4 = 2;
        iVar3 = 4;
        local_48 = 1.0;
        for (iVar5 = 1; iVar5 - (n - 1U >> 1) != 1; iVar5 = iVar5 + 1) {
          dVar8 = cos((double)uVar4 * *(double *)((long)pvVar1 + uVar2 * 8));
          local_48 = local_48 - (dVar8 + dVar8) / (double)(iVar3 * iVar5 + -1);
          w[uVar2] = local_48;
          iVar3 = iVar3 + 4;
          uVar4 = uVar4 + 2;
        }
        dVar8 = cos(*(double *)((long)pvVar1 + uVar2 * 8) * (dVar7 + 1.0));
        w[uVar2] = local_48 - dVar8 / dVar7;
      }
      for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
        w[uVar2] = (w[uVar2] + w[uVar2]) / dVar9;
      }
      operator_delete__(pvVar1);
      return;
    }
    *x = 0.0;
    *w = 2.0;
  }
  return;
}

Assistant:

void fejer2_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER2_COMPUTE computes a Fejer type 2 quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.
//
//    Thanks to Mike Neish, University of Toronto, for pointing out a
//    memory leak in a previous version of this code, 13 October 2009.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int j;
  double p;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "FEJER2_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }
  else if ( n == 2 )
  {
    x[0] = -0.5;
    x[1] = +0.5;
    w[0] = 1.0;
    w[1] = 1.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( n + 1 - i ) * r8_pi
               / double( n + 1     );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;

    for ( j = 1; j <= ( ( n - 1 ) / 2 ); j++ )
    {
      w[i] = w[i] - 2.0 * cos ( 2.0 * double( j ) * theta[i] ) 
        / double( 4 * j * j - 1 );
    }

    if ( 2 < n )
    {
      p = 2.0 * double( ( n + 1 ) / 2 ) - 1.0;
      w[i] = w[i] - cos ( ( p + 1.0 ) * theta[i] ) / p;
    }

  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 2.0 * w[i] / double( n + 1 );
  }

  delete [] theta;

  return;
}